

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.cc
# Opt level: O0

string * rcg::getComponetOfPart_abi_cxx11_
                   (shared_ptr<GenApi_3_4::CNodeMapRef> *nodemap,Buffer *buffer,uint32_t ipart)

{
  ulong uVar1;
  bool bVar2;
  int iVar3;
  element_type *peVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ulong uVar5;
  long *plVar6;
  undefined8 uVar7;
  long lVar8;
  uint64_t uVar9;
  size_t sVar10;
  size_t sVar11;
  uint in_ECX;
  string *in_RDI;
  exception *anon_var_0;
  GenericException *anon_var_0_1;
  int64_t val;
  IEnumEntry *entry;
  size_t i;
  NodeList_t list;
  IInteger *part;
  IEnumeration *sel;
  string *component;
  IBase *in_stack_fffffffffffffd60;
  char *in_stack_fffffffffffffd80;
  uint32_t part_00;
  Buffer *in_stack_fffffffffffffd88;
  Stream *in_stack_fffffffffffffd90;
  uint32_t part_01;
  Buffer *in_stack_fffffffffffffd98;
  long *local_230;
  long *local_1b0;
  long *local_190;
  gcstring local_158 [80];
  ulong local_108;
  long *local_100;
  ulong local_f8;
  node_vector local_f0 [16];
  gcstring local_e0 [80];
  long *local_90;
  gcstring local_78 [80];
  long *local_28;
  undefined1 local_1d;
  uint local_1c;
  
  local_1d = 0;
  local_1c = in_ECX;
  std::__cxx11::string::string(in_RDI);
  peVar4 = std::
           __shared_ptr_access<GenApi_3_4::CNodeMapRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<GenApi_3_4::CNodeMapRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x132da3);
  GenICam_3_4::gcstring::gcstring(local_78,"ChunkComponentSelector");
  iVar3 = (*(peVar4->super_CNodeMapRefT<GenApi_3_4::CGeneric_XMLLoaderParams>).
            super_CGeneric_XMLLoaderParams._vptr_CGeneric_XMLLoaderParams[7])(peVar4,local_78);
  if (CONCAT44(extraout_var,iVar3) == 0) {
    local_190 = (long *)0x0;
  }
  else {
    local_190 = (long *)__dynamic_cast(CONCAT44(extraout_var,iVar3),&GenApi_3_4::INode::typeinfo,
                                       &GenApi_3_4::IEnumeration::typeinfo,0xfffffffffffffffe);
  }
  GenICam_3_4::gcstring::~gcstring(local_78);
  local_28 = local_190;
  peVar4 = std::
           __shared_ptr_access<GenApi_3_4::CNodeMapRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<GenApi_3_4::CNodeMapRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x132ea3);
  GenICam_3_4::gcstring::gcstring(local_e0,"ChunkPartIndex");
  iVar3 = (*(peVar4->super_CNodeMapRefT<GenApi_3_4::CGeneric_XMLLoaderParams>).
            super_CGeneric_XMLLoaderParams._vptr_CGeneric_XMLLoaderParams[7])(peVar4,local_e0);
  if (CONCAT44(extraout_var_00,iVar3) == 0) {
    local_1b0 = (long *)0x0;
  }
  else {
    local_1b0 = (long *)__dynamic_cast(CONCAT44(extraout_var_00,iVar3),&GenApi_3_4::INode::typeinfo,
                                       &GenApi_3_4::IInteger::typeinfo,0xfffffffffffffffe);
  }
  GenICam_3_4::gcstring::~gcstring(local_e0);
  part_01 = (uint32_t)((ulong)in_stack_fffffffffffffd90 >> 0x20);
  part_00 = (uint32_t)((ulong)in_stack_fffffffffffffd80 >> 0x20);
  local_90 = local_1b0;
  if ((local_28 != (long *)0x0) && (local_1b0 != (long *)0x0)) {
    bVar2 = GenApi_3_4::IsReadable(in_stack_fffffffffffffd60);
    part_01 = (uint32_t)((ulong)in_stack_fffffffffffffd90 >> 0x20);
    part_00 = (uint32_t)((ulong)in_stack_fffffffffffffd80 >> 0x20);
    if (bVar2) {
      bVar2 = GenApi_3_4::IsWritable(in_stack_fffffffffffffd60);
      part_01 = (uint32_t)((ulong)in_stack_fffffffffffffd90 >> 0x20);
      part_00 = (uint32_t)((ulong)in_stack_fffffffffffffd80 >> 0x20);
      if (bVar2) {
        bVar2 = GenApi_3_4::IsReadable(in_stack_fffffffffffffd60);
        part_01 = (uint32_t)((ulong)in_stack_fffffffffffffd90 >> 0x20);
        part_00 = (uint32_t)((ulong)in_stack_fffffffffffffd80 >> 0x20);
        if (bVar2) {
          GenApi_3_4::node_vector::node_vector(local_f0);
          (**(code **)(*local_28 + 0x40))(local_28,local_f0);
          local_f8 = 0;
          while( true ) {
            uVar1 = local_f8;
            uVar5 = GenApi_3_4::node_vector::size();
            bVar2 = false;
            if (uVar1 < uVar5) {
              lVar8 = std::__cxx11::string::size();
              bVar2 = lVar8 == 0;
            }
            part_01 = (uint32_t)((ulong)in_stack_fffffffffffffd90 >> 0x20);
            part_00 = (uint32_t)((ulong)in_stack_fffffffffffffd80 >> 0x20);
            if (!bVar2) break;
            plVar6 = (long *)GenApi_3_4::node_vector::operator[]((ulong)local_f0);
            if (*plVar6 == 0) {
              local_230 = (long *)0x0;
            }
            else {
              local_230 = (long *)__dynamic_cast(*plVar6,&GenApi_3_4::INode::typeinfo,
                                                 &GenApi_3_4::IEnumEntry::typeinfo,
                                                 0xfffffffffffffffe);
            }
            local_100 = local_230;
            if ((local_230 != (long *)0x0) &&
               (bVar2 = GenApi_3_4::IsReadable(in_stack_fffffffffffffd60), plVar6 = local_28, bVar2)
               ) {
              uVar7 = (**(code **)(*local_100 + 0x38))();
              (**(code **)(*plVar6 + 0x50))(plVar6,uVar7,1);
              local_108 = (**(code **)(*local_90 + 0x48))(local_90,0);
              if (local_108 == local_1c) {
                in_stack_fffffffffffffd98 =
                     (Buffer *)GenApi_3_4::node_vector::operator[]((ulong)local_f0);
                in_stack_fffffffffffffd90 = in_stack_fffffffffffffd98->parent;
                if (in_stack_fffffffffffffd90 == (Stream *)0x0) {
                  in_stack_fffffffffffffd88 = (Buffer *)0x0;
                }
                else {
                  in_stack_fffffffffffffd88 =
                       (Buffer *)
                       __dynamic_cast(in_stack_fffffffffffffd90,&GenApi_3_4::INode::typeinfo,
                                      &GenApi_3_4::IEnumEntry::typeinfo,0xfffffffffffffffe);
                }
                (*(code *)(in_stack_fffffffffffffd88->parent->buffer).nodemap.
                          super___shared_ptr<GenApi_3_4::CNodeMapRef,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr)(local_158);
                in_stack_fffffffffffffd80 = GenICam_3_4::gcstring::operator_cast_to_char_(local_158)
                ;
                std::__cxx11::string::operator=(in_RDI,in_stack_fffffffffffffd80);
                GenICam_3_4::gcstring::~gcstring(local_158);
              }
            }
            local_f8 = local_f8 + 1;
          }
          GenApi_3_4::node_vector::~node_vector(local_f0);
        }
      }
    }
  }
  lVar8 = std::__cxx11::string::size();
  if (lVar8 != 0) {
    return in_RDI;
  }
  bVar2 = Buffer::getImagePresent(in_stack_fffffffffffffd88,part_00);
  if (!bVar2) {
    return in_RDI;
  }
  uVar9 = Buffer::getPixelFormat(in_stack_fffffffffffffd98,part_01);
  if (uVar9 != 0x1080001) {
    if (uVar9 == 0x10800c6) {
      std::__cxx11::string::operator=(in_RDI,"Confidence");
      return in_RDI;
    }
    if (uVar9 == 0x11000b8) {
      std::__cxx11::string::operator=(in_RDI,"Disparity");
      return in_RDI;
    }
    if (uVar9 != 0x20c005a) {
      if (uVar9 != 0x81080001) {
        return in_RDI;
      }
      std::__cxx11::string::operator=(in_RDI,"Error");
      return in_RDI;
    }
  }
  sVar10 = Buffer::getWidth(in_stack_fffffffffffffd98,part_01);
  sVar11 = Buffer::getHeight(in_stack_fffffffffffffd98,part_01);
  if (sVar10 < sVar11) {
    std::__cxx11::string::operator=(in_RDI,"IntensityCombined");
  }
  else {
    std::__cxx11::string::operator=(in_RDI,"Intensity");
  }
  return in_RDI;
}

Assistant:

std::string getComponetOfPart(const std::shared_ptr<GenApi::CNodeMapRef> &nodemap,
                              const Buffer *buffer, uint32_t ipart)
{
  std::string component;

  try
  {
    // get chunk component selector and proprietary chunk part index parmeters

    GenApi::IEnumeration *sel=dynamic_cast<GenApi::IEnumeration *>(nodemap->_GetNode("ChunkComponentSelector"));
    GenApi::IInteger *part=dynamic_cast<GenApi::IInteger *>(nodemap->_GetNode("ChunkPartIndex"));

    if (sel != 0 && part != 0)
    {
      if (GenApi::IsReadable(sel) && GenApi::IsWritable(sel) && GenApi::IsReadable(part))
      {
        // go through all available enumerations

        GenApi::NodeList_t list;
        sel->GetEntries(list);

        for (size_t i=0; i<list.size() && component.size() == 0; i++)
        {
          GenApi::IEnumEntry *entry=dynamic_cast<GenApi::IEnumEntry *>(list[i]);

          if (entry != 0 && GenApi::IsReadable(entry))
          {
            sel->SetIntValue(entry->GetValue());

            int64_t val=part->GetValue();
            if (val == ipart)
            {
              component=dynamic_cast<GenApi::IEnumEntry *>(list[i])->GetSymbolic();
            }
          }
        }
      }
    }
  }
  catch (const std::exception &)
  { /* ignore errors */ }
  catch (const GENICAM_NAMESPACE::GenericException &)
  { /* ignore errors */ }

  // try guessing component name from pixel format

  if (component.size() == 0 && buffer->getImagePresent(ipart))
  {
    switch (buffer->getPixelFormat(ipart))
    {
      case Mono8:
      case YCbCr411_8:
        if (buffer->getWidth(ipart) >= buffer->getHeight(ipart))
        {
          component="Intensity";
        }
        else
        {
          component="IntensityCombined";
        }
        break;

      case Coord3D_C16:
        component="Disparity";
        break;

      case Confidence8:
        component="Confidence";
        break;

      case Error8:
        component="Error";
        break;

      default:
        break;
    }
  }

  return component;
}